

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_abcd_8_mm_axy7(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint address;
  uint uVar6;
  
  uVar2 = OPER_A7_PD_8();
  address = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = address;
  uVar3 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  uVar5 = (uVar3 & 0xf) + (uVar2 & 0xf) + (uint)((m68ki_cpu.x_flag >> 8 & 1) != 0);
  uVar1 = uVar5 + 6;
  if (uVar5 < 10) {
    uVar1 = uVar5;
  }
  iVar4 = (uVar3 & 0xf0) + (uVar2 & 0xf0);
  uVar6 = iVar4 + uVar1;
  m68ki_cpu.n_flag = (uVar1 - 0xa0) + iVar4;
  if (0x99 >= uVar6) {
    m68ki_cpu.n_flag = uVar6;
  }
  m68ki_cpu.x_flag = (uint)(0x99 < uVar6) << 8;
  m68ki_cpu.v_flag = ~uVar5 & m68ki_cpu.n_flag;
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | m68ki_cpu.n_flag & 0xff;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.n_flag & 0xff);
  return;
}

Assistant:

static void m68k_op_abcd_8_mm_axy7(void)
{
	uint src = OPER_A7_PD_8();
	uint ea  = EA_A7_PD_8();
	uint dst = m68ki_read_8(ea);
	uint res = LOW_NIBBLE(src) + LOW_NIBBLE(dst) + XFLAG_AS_1();

	FLAG_V = ~res; /* Undefined V behavior */

	if(res > 9)
		res += 6;
	res += HIGH_NIBBLE(src) + HIGH_NIBBLE(dst);
	FLAG_X = FLAG_C = (res > 0x99) << 8;
	if(FLAG_C)
		res -= 0xa0;

	FLAG_V &= res; /* Undefined V behavior part II */
	FLAG_N = NFLAG_8(res); /* Undefined N behavior */

	res = MASK_OUT_ABOVE_8(res);
	FLAG_Z |= res;

	m68ki_write_8(ea, res);
}